

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> * __thiscall
Algorithms::mulComplex
          (pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>
           *__return_storage_ptr__,Algorithms *this,
          pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *a,
          pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *b,BigInteger *w,
          BigInteger *mod)

{
  BigInteger local_1a8;
  BigInteger local_188;
  BigInteger local_168;
  BigInteger local_148;
  BigInteger local_128;
  BigInteger local_f8;
  BigInteger local_d8;
  BigInteger local_b8;
  BigInteger local_98;
  BigInteger local_78;
  BigInteger local_58;
  BigInteger *local_38;
  BigInteger *mod_local;
  BigInteger *w_local;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *b_local;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *a_local;
  Algorithms *this_local;
  
  local_38 = mod;
  mod_local = w;
  w_local = &b->first;
  b_local = a;
  a_local = (pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *)this;
  this_local = (Algorithms *)__return_storage_ptr__;
  BigIntegerLibrary::BigInteger::operator*(&local_b8,&a->first,&b->first);
  BigIntegerLibrary::BigInteger::operator*(&local_f8,&a->second,&b->second);
  BigIntegerLibrary::BigInteger::operator*(&local_d8,&local_f8,w);
  BigIntegerLibrary::BigInteger::operator+(&local_98,&local_b8,&local_d8);
  BigIntegerLibrary::BigInteger::operator+(&local_78,&local_98,mod);
  BigIntegerLibrary::BigInteger::operator%(&local_58,&local_78,mod);
  BigIntegerLibrary::BigInteger::operator*(&local_188,&a->second,&b->first);
  BigIntegerLibrary::BigInteger::operator*(&local_1a8,&a->first,&b->second);
  BigIntegerLibrary::BigInteger::operator+(&local_168,&local_188,&local_1a8);
  BigIntegerLibrary::BigInteger::operator+(&local_148,&local_168,mod);
  BigIntegerLibrary::BigInteger::operator%(&local_128,&local_148,mod);
  std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
            (__return_storage_ptr__,&local_58,&local_128);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_128);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_148);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_168);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_1a8);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_188);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_58);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_78);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_98);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_d8);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_f8);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

pair<BigInteger, BigInteger>
Algorithms::mulComplex(pair<BigInteger, BigInteger> a, pair<BigInteger, BigInteger> b, BigInteger w, BigInteger mod) {
    return {(a.first * b.first + a.second * b.second * w + mod) % mod, (a.second * b.first + a.first * b.second + mod) % mod};
}